

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O3

int Abc_ZddBuildSet(Abc_ZddMan *p,int *pSet,int Size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (1 < Size) {
    uVar2 = 1;
    uVar6 = 0;
    do {
      uVar5 = uVar6 & 0xffffffff;
      uVar3 = uVar2;
      do {
        uVar4 = (uint)uVar3;
        if (pSet[(int)(uint)uVar5] <= pSet[uVar3]) {
          uVar4 = (uint)uVar5;
        }
        uVar3 = uVar3 + 1;
        uVar5 = (ulong)uVar4;
      } while ((uint)Size != uVar3);
      iVar1 = pSet[uVar6];
      pSet[uVar6] = pSet[(int)uVar4];
      uVar6 = uVar6 + 1;
      pSet[(int)uVar4] = iVar1;
      uVar2 = uVar2 + 1;
    } while (uVar6 != Size - 1);
  }
  if (Size < 1) {
    iVar1 = 1;
  }
  else {
    uVar6 = (ulong)(uint)Size + 1;
    iVar1 = 1;
    do {
      iVar1 = Abc_ZddUniqueCreate(p,pSet[uVar6 - 2],iVar1,0);
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  return iVar1;
}

Assistant:

int Abc_ZddBuildSet( Abc_ZddMan * p, int * pSet, int Size )
{
    int i, Res = 1;
    Vec_IntSelectSort( pSet, Size );
    for ( i = Size - 1; i >= 0; i-- )
        Res = Abc_ZddUniqueCreate( p, pSet[i], Res, 0 );
    return Res;
}